

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void masked_variance4xh(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,uint8_t *b_ptr,uint8_t *m_ptr
                       ,int m_stride,int height,uint *sse,int *sum_)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i sum_sq;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  longlong local_98;
  longlong lStack_90;
  longlong local_88;
  longlong lStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_88 = 0;
  lStack_80 = 0;
  local_98 = 0;
  lStack_90 = 0;
  for (lVar1 = 0; (int)lVar1 < height; lVar1 = lVar1 + 4) {
    uStack_3c = *(undefined4 *)(src_ptr + src_stride * 3);
    uStack_40 = *(undefined4 *)(src_ptr + src_stride * 2);
    uStack_44 = *(undefined4 *)(src_ptr + src_stride);
    local_48 = *(undefined4 *)src_ptr;
    local_58 = *(longlong *)(a_ptr + lVar1 * 4);
    lStack_50 = *(longlong *)((long)(a_ptr + lVar1 * 4) + 8);
    local_68 = *(longlong *)(b_ptr + lVar1 * 4);
    lStack_60 = *(longlong *)((long)(b_ptr + lVar1 * 4) + 8);
    uStack_6c = *(undefined4 *)(m_ptr + m_stride * 3);
    uStack_70 = *(undefined4 *)(m_ptr + m_stride * 2);
    uStack_74 = *(undefined4 *)(m_ptr + m_stride);
    local_78 = *(undefined4 *)m_ptr;
    accumulate_block((__m128i *)&local_48,(__m128i *)&local_58,(__m128i *)&local_68,
                     (__m128i *)&local_78,(__m128i *)&local_88,(__m128i *)&local_98);
    src_ptr = src_ptr + src_stride * 4;
    m_ptr = m_ptr + m_stride * 4;
  }
  auVar2._8_8_ = lStack_80;
  auVar2._0_8_ = local_88;
  auVar3._8_8_ = lStack_90;
  auVar3._0_8_ = local_98;
  auVar2 = phaddd(auVar2,auVar3);
  auVar2 = phaddd(auVar2,auVar2);
  *sum_ = auVar2._0_4_;
  auVar3 = phaddd(auVar3,auVar3);
  auVar3 = phaddd(auVar3,auVar3);
  *sse = auVar3._0_4_;
  return;
}

Assistant:

static void masked_variance4xh(const uint8_t *src_ptr, int src_stride,
                               const uint8_t *a_ptr, const uint8_t *b_ptr,
                               const uint8_t *m_ptr, int m_stride, int height,
                               unsigned int *sse, int *sum_) {
  int y;
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();

  for (y = 0; y < height; y += 4) {
    // Load four rows at a time
    __m128i src = _mm_setr_epi32(*(int *)src_ptr, *(int *)&src_ptr[src_stride],
                                 *(int *)&src_ptr[src_stride * 2],
                                 *(int *)&src_ptr[src_stride * 3]);
    const __m128i a = _mm_loadu_si128((const __m128i *)a_ptr);
    const __m128i b = _mm_loadu_si128((const __m128i *)b_ptr);
    const __m128i m = _mm_setr_epi32(*(int *)m_ptr, *(int *)&m_ptr[m_stride],
                                     *(int *)&m_ptr[m_stride * 2],
                                     *(int *)&m_ptr[m_stride * 3]);
    accumulate_block(&src, &a, &b, &m, &sum, &sum_sq);

    src_ptr += src_stride * 4;
    a_ptr += 16;
    b_ptr += 16;
    m_ptr += m_stride * 4;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, sum);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}